

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

u32 __thiscall
moira::Moira::read<(moira::Core)1,(moira::AddrSpace)1,1,16384ull>(Moira *this,u32 addr)

{
  bool bVar1;
  uint uVar2;
  
  this->fcl = '\x01';
  if ((this->flags & 0x100) != 0) {
    bVar1 = Debugger::watchpointMatches(&this->debugger,addr,1);
    if (bVar1) {
      (*this->_vptr_Moira[0x16])(this,addr);
    }
  }
  uVar2 = (*this->_vptr_Moira[3])(this,(ulong)(addr & 0xffffff));
  return uVar2 & 0xff;
}

Assistant:

u32
Moira::read(u32 addr)
{
    u32 result;

    // Update function code pins
    setFC(AS == AddrSpace::DATA ? FC::USER_DATA : FC::USER_PROG);
    SYNC(2);

    // Check for address errors
    if (misaligned<C, S>(addr)) {
        throw AddressError(makeFrame<F>(addr));
    }

    // Check if a watchpoint has been reached
    if ((flags & State::CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        didReachWatchpoint(addr);
    }

    if constexpr (S == Byte) {

        if (F & POLL) POLL_IPL;
        result = read8(addr & addrMask<C>());
        SYNC(2);
    }

    if constexpr (S == Word) {

        if (F & POLL) POLL_IPL;
        result = read16(addr & addrMask<C>());
        SYNC(2);
    }

    if constexpr (S == Long) {

        result = read16(addr & addrMask<C>()) << 16;
        SYNC(4);
        if (F & POLL) POLL_IPL;
        result |= read16((addr + 2) & addrMask<C>());
        SYNC(2);
    }

    return result;
}